

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  long *plVar5;
  uint *puVar6;
  undefined8 *puVar7;
  unsigned_long *puVar8;
  size_t l;
  StkId pTVar9;
  size_t l_00;
  int *piVar10;
  Value *pVVar11;
  Value VVar12;
  int total;
  char *__s;
  char buff;
  char local_50 [32];
  
  total = 1;
  do {
    pcVar4 = strchr(fmt,0x25);
    if (pcVar4 == (char *)0x0) {
      if ((long)L->stack_last - (long)L->top < 0x11) {
        luaD_growstack(L,1);
      }
      l_00 = strlen(fmt);
      pushstr(L,fmt,l_00);
      if (total != 1) {
        luaV_concat(L,total);
      }
      return (char *)(L->top[-1].value_.f + 0x18);
    }
    pushstr(L,fmt,(long)pcVar4 - (long)fmt);
    cVar1 = pcVar4[1];
    if (cVar1 == '%') {
      __s = "%";
LAB_001110f0:
      l = 1;
LAB_001111a7:
      pushstr(L,__s,l);
    }
    else if (cVar1 == 'I') {
      pTVar9 = L->top;
      uVar2 = argp->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        pVVar11 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        pVVar11 = (Value *)argp->overflow_arg_area;
        argp->overflow_arg_area = pVVar11 + 1;
      }
      VVar12 = *pVVar11;
LAB_001111bd:
      pTVar9->value_ = VVar12;
      iVar3 = 0x13;
LAB_001111c2:
      pTVar9->tt_ = iVar3;
      luaD_inctop(L);
      luaO_tostring(L,L->top + -1);
    }
    else {
      if (cVar1 == 'U') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar8 = (unsigned_long *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          puVar8 = (unsigned_long *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar8 + 1;
        }
        iVar3 = luaO_utf8esc(&buff,*puVar8);
        l = (size_t)iVar3;
        __s = local_50 + -l;
        goto LAB_001111a7;
      }
      if (cVar1 != 'c') {
        if (cVar1 == 'd') {
          pTVar9 = L->top;
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            piVar10 = (int *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            piVar10 = (int *)argp->overflow_arg_area;
            argp->overflow_arg_area = piVar10 + 2;
          }
          VVar12 = (Value)(long)*piVar10;
          goto LAB_001111bd;
        }
        if (cVar1 != 'f') {
          if (cVar1 == 'p') {
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              puVar7 = (undefined8 *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              puVar7 = (undefined8 *)argp->overflow_arg_area;
              argp->overflow_arg_area = puVar7 + 1;
            }
            iVar3 = snprintf(&buff,0x28,"%p",*puVar7);
            l = (size_t)iVar3;
            __s = &buff;
          }
          else {
            if (cVar1 != 's') {
              luaG_runerror(L,"invalid option \'%%%c\' to \'lua_pushfstring\'",
                            (ulong)(uint)(int)cVar1);
            }
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              plVar5 = (long *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              plVar5 = (long *)argp->overflow_arg_area;
              argp->overflow_arg_area = plVar5 + 1;
            }
            __s = (char *)*plVar5;
            if (__s == (char *)0x0) {
              __s = "(null)";
            }
            l = strlen(__s);
          }
          goto LAB_001111a7;
        }
        pTVar9 = L->top;
        uVar2 = argp->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          pVVar11 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->fp_offset = uVar2 + 0x10;
        }
        else {
          pVVar11 = (Value *)argp->overflow_arg_area;
          argp->overflow_arg_area = pVVar11 + 1;
        }
        pTVar9->value_ = *pVVar11;
        iVar3 = 3;
        goto LAB_001111c2;
      }
      uVar2 = argp->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar6 = (uint *)((ulong)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        puVar6 = (uint *)argp->overflow_arg_area;
        argp->overflow_arg_area = puVar6 + 2;
      }
      buff = (char)*puVar6;
      __s = &buff;
      if ((""[(ulong)(*puVar6 & 0xff) + 1] & 4) != 0) goto LAB_001110f0;
      luaO_pushfstring(L,"<\\%d>");
    }
    fmt = pcVar4 + 2;
    total = total + 2;
  } while( true );
}

Assistant:

const char *luaO_pushvfstring(lua_State *L, const char *fmt, va_list argp) {
    int n = 0;
    for (;;) {
        const char *e = strchr(fmt, '%');
        if (e == NULL) break;
        pushstr(L, fmt, e - fmt);
        switch (*(e + 1)) {
            case 's': {  /* zero-terminated string */
                const char *s = va_arg(argp, char *);
                if (s == NULL) s = "(null)";
                pushstr(L, s, strlen(s));
                break;
            }
            case 'c': {  /* an 'int' as a character */
                char buff = cast(char, va_arg(argp,
                        int));
                if (lisprint(cast_uchar(buff)))
                    pushstr(L, &buff, 1);
                else  /* non-printable character; print its code */
                    luaO_pushfstring(L, "<\\%d>", cast_uchar(buff));
                break;
            }
            case 'd': {  /* an 'int' */
                setivalue(L->top, va_arg(argp,
                        int));
                goto top2str;
            }
            case 'I': {  /* a 'lua_Integer' */
                setivalue(L->top, cast(lua_Integer, va_arg(argp, l_uacInt)));
                goto top2str;
            }
            case 'f': {  /* a 'lua_Number' */
                setfltvalue(L->top, cast_num(va_arg(argp, l_uacNumber)));
                top2str:  /* convert the top element to a string */
                luaD_inctop(L);
                luaO_tostring(L, L->top - 1);
                break;
            }
            case 'p': {  /* a pointer */
                char buff[4 * sizeof(void *) + 8]; /* should be enough space for a '%p' */
                int l = l_sprintf(buff, sizeof(buff), "%p", va_arg(argp,
                        void *));
                pushstr(L, buff, l);
                break;
            }
            case 'U': {  /* an 'int' as a UTF-8 sequence */
                char buff[UTF8BUFFSZ];
                int l = luaO_utf8esc(buff, cast(long, va_arg(argp,
                        long)));
                pushstr(L, buff + UTF8BUFFSZ - l, l);
                break;
            }
            case '%': {
                pushstr(L, "%", 1);
                break;
            }
            default: {
                luaG_runerror(L, "invalid option '%%%c' to 'lua_pushfstring'",
                              *(e + 1));
            }
        }
        n += 2;
        fmt = e + 2;
    }
    luaD_checkstack(L, 1);
    pushstr(L, fmt, strlen(fmt));
    if (n > 0) luaV_concat(L, n + 1);
    return svalue(L->top - 1);
}